

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Light.cpp
# Opt level: O0

void __thiscall OpenMD::Perturbations::Light::modifyForces(Light *this)

{
  double dVar1;
  bool bVar2;
  undefined1 uVar3;
  SnapshotManager *pSVar4;
  Snapshot *pSVar5;
  double *pdVar6;
  Vector<double,_7U> *this_00;
  long in_RDI;
  RealType RVar7;
  double dVar8;
  Snapshot *snap;
  MultipoleAdapter ma;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  complex<double> Ey;
  complex<double> Ex;
  complex<double> argument;
  RealType t;
  bool isCharge;
  Mat3x3d I;
  Vector3d BF;
  Vector3d EF;
  Vector3d EFk;
  Vector3d av;
  Vector3d J;
  Vector3d D;
  Vector3d trq;
  Vector3d f;
  Vector3d v;
  Vector3d rp;
  Vector3d r;
  RealType fPot;
  RealType U;
  RealType C;
  int n;
  int m;
  int l;
  potVec longRangePotential;
  AtomType *atype;
  Atom *atom;
  Molecule *mol;
  AtomIterator j;
  MoleculeIterator i;
  Snapshot *in_stack_fffffffffffff8d8;
  StuntDouble *in_stack_fffffffffffff8e0;
  StuntDouble *in_stack_fffffffffffff8e8;
  Vector<double,_7U> *v_00;
  StuntDouble *in_stack_fffffffffffff8f0;
  iterator *in_stack_fffffffffffff8f8;
  SimInfo *in_stack_fffffffffffff900;
  Molecule *in_stack_fffffffffffff908;
  Vector3<double> *in_stack_fffffffffffff940;
  Vector3<double> *in_stack_fffffffffffff948;
  uint in_stack_fffffffffffff978;
  undefined2 in_stack_fffffffffffff97c;
  undefined1 local_458 [240];
  MultipoleAdapter local_368 [9];
  Light *in_stack_fffffffffffffce0;
  FluctuatingChargeAdapter local_318;
  FixedChargeAdapter local_310 [14];
  complex<double> local_2a0 [2];
  double local_278;
  complex<double> local_270;
  complex<double> local_260 [6];
  RealType local_1f8;
  byte local_1e9;
  RectMatrix<double,_3U,_3U> local_1e8;
  Vector3<double> local_170;
  Vector<double,_3U> local_158;
  Vector<double,_3U> local_140 [5];
  Vector3<double> local_c8 [2];
  Vector<double,_7U> *local_98;
  double local_90;
  RealType local_88;
  uint local_7c;
  uint local_78;
  uint local_74;
  double local_70;
  Vector<double,_7U> local_68;
  AtomType *local_30;
  Atom *local_28;
  Molecule *local_20;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  if ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
    initialize(in_stack_fffffffffffffce0);
  }
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_18);
  local_70 = 0.0;
  Vector<double,_7U>::Vector(&local_68,&local_70);
  local_88 = 0.0;
  local_90 = 0.0;
  local_98 = (Vector<double,_7U> *)0x0;
  Vector3<double>::Vector3((Vector3<double> *)0x185d7e);
  Vector3<double>::Vector3((Vector3<double> *)0x185d8b);
  Vector3<double>::Vector3((Vector3<double> *)0x185d98);
  Vector3<double>::Vector3((Vector3<double> *)0x185da5);
  Vector3<double>::Vector3((Vector3<double> *)0x185db2);
  Vector3<double>::Vector3((Vector3<double> *)0x185dbf);
  Vector3<double>::Vector3((Vector3<double> *)0x185dcc);
  Vector3<double>::Vector3((Vector3<double> *)0x185dd9);
  Vector3<double>::Vector3((Vector3<double> *)0x185de6);
  Vector3<double>::Vector3((Vector3<double> *)0x185df3);
  Vector3<double>::Vector3((Vector3<double> *)0x185e00);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x185e0d);
  if ((*(byte *)(in_RDI + 0x11) & 1) != 0) {
    pSVar4 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 0x18));
    pSVar5 = SnapshotManager::getCurrentSnapshot(pSVar4);
    local_1f8 = Snapshot::getTime(pSVar5);
    local_90 = 0.0;
    local_98 = (Vector<double,_7U> *)0x0;
    local_20 = SimInfo::beginMolecule
                         (in_stack_fffffffffffff900,(MoleculeIterator *)in_stack_fffffffffffff8f8);
    while (local_20 != (Molecule *)0x0) {
      local_28 = Molecule::beginAtom((Molecule *)in_stack_fffffffffffff900,in_stack_fffffffffffff8f8
                                    );
      while (local_28 != (Atom *)0x0) {
        local_1e9 = 0;
        local_88 = 0.0;
        local_30 = Atom::getAtomType(local_28);
        StuntDouble::getPos(in_stack_fffffffffffff8e8);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffff8e0,
                   (Vector3<double> *)in_stack_fffffffffffff8d8);
        StuntDouble::getVel(in_stack_fffffffffffff8e8);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffff8e0,
                   (Vector3<double> *)in_stack_fffffffffffff8d8);
        OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff908,
                          (Vector<double,_3U> *)in_stack_fffffffffffff900);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffff8e8,
                   (Vector<double,_3U> *)in_stack_fffffffffffff8e0);
        dVar8 = *(double *)(in_RDI + 0x68);
        pdVar6 = Vector3<double>::z(local_c8);
        dVar8 = dVar8 * *pdVar6 - *(double *)(in_RDI + 0x58) * local_1f8;
        std::complex<double>::complex(local_260,0.0,dVar8);
        std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                  ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                   (in_RDI + 0x78),0);
        std::operator*((double *)in_stack_fffffffffffff8d8,(complex<double> *)0x186091);
        local_278 = dVar8;
        std::exp<double>((complex<double> *)in_stack_fffffffffffff8f0);
        std::operator*((complex<double> *)in_stack_fffffffffffff8d8,(complex<double> *)0x186123);
        std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                  ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                   (in_RDI + 0x78),1);
        std::operator*((double *)in_stack_fffffffffffff8d8,(complex<double> *)0x186190);
        std::exp<double>((complex<double> *)in_stack_fffffffffffff8f0);
        std::operator*((complex<double> *)in_stack_fffffffffffff8d8,(complex<double> *)0x186222);
        dVar8 = std::complex<double>::real_abi_cxx11_(&local_270);
        pdVar6 = Vector3<double>::x(&local_170);
        *pdVar6 = dVar8;
        dVar8 = std::complex<double>::real_abi_cxx11_(local_2a0);
        pdVar6 = Vector3<double>::y(&local_170);
        *pdVar6 = dVar8;
        pdVar6 = Vector3<double>::z(&local_170);
        *pdVar6 = 0.0;
        OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff908,
                          (Vector<double,_3U> *)in_stack_fffffffffffff900);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffff8e8,
                   (Vector<double,_3U> *)in_stack_fffffffffffff8e0);
        cross<double>(in_stack_fffffffffffff948,in_stack_fffffffffffff940);
        operator/((Vector<double,_3U> *)in_stack_fffffffffffff8e8,(double)in_stack_fffffffffffff8e0)
        ;
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffff8e8,
                   (Vector<double,_3U> *)in_stack_fffffffffffff8e0);
        StuntDouble::addElectricField
                  (in_stack_fffffffffffff8f0,(Vector3d *)in_stack_fffffffffffff8e8);
        FixedChargeAdapter::FixedChargeAdapter(local_310,local_30);
        bVar2 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)0x1863d9);
        if (bVar2) {
          local_1e9 = 1;
          local_88 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)in_stack_fffffffffffff8e0);
        }
        FluctuatingChargeAdapter::FluctuatingChargeAdapter(&local_318,local_30);
        bVar2 = FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)0x186460);
        if (bVar2) {
          local_1e9 = 1;
          RVar7 = StuntDouble::getFlucQPos(in_stack_fffffffffffff8e0);
          local_88 = local_88 + RVar7;
          dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffff8f0,
                         (Vector<double,_3U> *)in_stack_fffffffffffff8e8);
          StuntDouble::addFlucQFrc(in_stack_fffffffffffff8f0,(RealType)in_stack_fffffffffffff8e8);
        }
        if ((local_1e9 & 1) != 0) {
          cross<double>(in_stack_fffffffffffff948,in_stack_fffffffffffff940);
          OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff8e8,
                            (Vector<double,_3U> *)in_stack_fffffffffffff8e0);
          OpenMD::operator*((double)in_stack_fffffffffffff8e8,
                            (Vector<double,_3U> *)in_stack_fffffffffffff8e0);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffff8e8,
                     (Vector<double,_3U> *)in_stack_fffffffffffff8e0);
          StuntDouble::addFrc(in_stack_fffffffffffff8f0,(Vector3d *)in_stack_fffffffffffff8e8);
          local_90 = dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffff8f0,
                                    (Vector<double,_3U> *)in_stack_fffffffffffff8e8);
          local_90 = -local_90;
          if ((*(byte *)(in_RDI + 0x12) & 1) != 0) {
            StuntDouble::addParticlePot
                      (in_stack_fffffffffffff8f0,(RealType *)in_stack_fffffffffffff8e8);
          }
          local_98 = (Vector<double,_7U> *)(local_90 + (double)local_98);
        }
        MultipoleAdapter::MultipoleAdapter(local_368,local_30);
        uVar3 = MultipoleAdapter::isDipole((MultipoleAdapter *)in_stack_fffffffffffff948);
        if ((bool)uVar3) {
          StuntDouble::getDipole(in_stack_fffffffffffff8e8);
          OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffff8e8,
                            (double)in_stack_fffffffffffff8e0);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffff8e8,
                     (Vector<double,_3U> *)in_stack_fffffffffffff8e0);
          cross<double>(in_stack_fffffffffffff948,in_stack_fffffffffffff940);
          cross<double>(in_stack_fffffffffffff948,in_stack_fffffffffffff940);
          cross<double>(in_stack_fffffffffffff948,in_stack_fffffffffffff940);
          OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff8e8,
                            (Vector<double,_3U> *)in_stack_fffffffffffff8e0);
          Vector<double,_3U>::operator+=
                    ((Vector<double,_3U> *)in_stack_fffffffffffff8e0,
                     (Vector<double,_3U> *)in_stack_fffffffffffff8d8);
          StuntDouble::addTrq(in_stack_fffffffffffff8f0,(Vector3d *)in_stack_fffffffffffff8e8);
          StuntDouble::getJ(in_stack_fffffffffffff8e8);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffff8e0,
                     (Vector3<double> *)in_stack_fffffffffffff8d8);
          (*(local_28->super_StuntDouble)._vptr_StuntDouble[5])(local_458);
          SquareMatrix3<double>::operator=
                    ((SquareMatrix3<double> *)in_stack_fffffffffffff8e0,
                     (SquareMatrix3<double> *)in_stack_fffffffffffff8d8);
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1867da);
          bVar2 = StuntDouble::isLinear(&local_28->super_StuntDouble);
          if (bVar2) {
            in_stack_fffffffffffff978 = StuntDouble::linearAxis(&local_28->super_StuntDouble);
            local_78 = in_stack_fffffffffffff978 + 1 +
                       ((int)(in_stack_fffffffffffff978 + 1) / 3) * -3;
            local_7c = in_stack_fffffffffffff978 + 2 +
                       ((int)(in_stack_fffffffffffff978 + 2) / 3) * -3;
            local_74 = in_stack_fffffffffffff978;
            pdVar6 = Vector<double,_3U>::operator[](&local_158,in_stack_fffffffffffff978);
            *pdVar6 = 0.0;
            pdVar6 = Vector<double,_3U>::operator[](local_140,local_78);
            dVar8 = *pdVar6;
            pdVar6 = RectMatrix<double,_3U,_3U>::operator()(&local_1e8,local_78,local_78);
            in_stack_fffffffffffff948 = (Vector3<double> *)(dVar8 / *pdVar6);
            pdVar6 = Vector<double,_3U>::operator[](&local_158,local_78);
            *pdVar6 = (double)in_stack_fffffffffffff948;
            in_stack_fffffffffffff940 =
                 (Vector3<double> *)Vector<double,_3U>::operator[](local_140,local_7c);
            dVar8 = (in_stack_fffffffffffff940->super_Vector<double,_3U>).data_[0];
            pdVar6 = RectMatrix<double,_3U,_3U>::operator()(&local_1e8,local_7c,local_7c);
            dVar1 = *pdVar6;
            pdVar6 = Vector<double,_3U>::operator[](&local_158,local_7c);
            *pdVar6 = dVar8 / dVar1;
          }
          else {
            SquareMatrix3<double>::inverse
                      ((SquareMatrix3<double> *)
                       CONCAT17(uVar3,CONCAT16(bVar2,CONCAT24(in_stack_fffffffffffff97c,
                                                              in_stack_fffffffffffff978))));
            OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff908,
                              (Vector<double,_3U> *)in_stack_fffffffffffff900);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffff8e8,
                       (Vector<double,_3U> *)in_stack_fffffffffffff8e0);
            SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x186a6d);
          }
          cross<double>(in_stack_fffffffffffff948,in_stack_fffffffffffff940);
          cross<double>(in_stack_fffffffffffff948,in_stack_fffffffffffff940);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffff8e0,
                     (Vector3<double> *)in_stack_fffffffffffff8d8);
          StuntDouble::addFrc(in_stack_fffffffffffff8f0,(Vector3d *)in_stack_fffffffffffff8e8);
          local_90 = dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffff8f0,
                                    (Vector<double,_3U> *)in_stack_fffffffffffff8e8);
          local_90 = -local_90;
          if ((*(byte *)(in_RDI + 0x12) & 1) != 0) {
            StuntDouble::addParticlePot
                      (in_stack_fffffffffffff8f0,(RealType *)in_stack_fffffffffffff8e8);
          }
          local_98 = (Vector<double,_7U> *)(local_90 + (double)local_98);
        }
        local_28 = Molecule::nextAtom((Molecule *)in_stack_fffffffffffff900,
                                      in_stack_fffffffffffff8f8);
      }
      in_stack_fffffffffffff908 =
           SimInfo::nextMolecule
                     (in_stack_fffffffffffff900,(MoleculeIterator *)in_stack_fffffffffffff8f8);
      local_20 = in_stack_fffffffffffff908;
    }
    pSVar4 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 0x18));
    pSVar5 = SnapshotManager::getCurrentSnapshot(pSVar4);
    Snapshot::getLongRangePotentials(in_stack_fffffffffffff8d8);
    Vector<double,_7U>::operator=
              ((Vector<double,_7U> *)in_stack_fffffffffffff8e8,
               (Vector<double,_7U> *)in_stack_fffffffffffff8e0);
    v_00 = local_98;
    this_00 = (Vector<double,_7U> *)Vector<double,_7U>::operator[](&local_68,2);
    this_00->data_[0] = this_00->data_[0] + (double)v_00;
    Vector<double,_7U>::Vector(this_00,v_00);
    Snapshot::setLongRangePotentials(pSVar5,(potVec *)in_stack_fffffffffffff8d8);
  }
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x186cd4);
  return;
}

Assistant:

void Light::modifyForces() {
    if (!initialized) initialize();

    SimInfo::MoleculeIterator i;
    Molecule::AtomIterator j;
    Molecule* mol;
    Atom* atom;
    AtomType* atype;
    potVec longRangePotential(0.0);
    int l, m, n;
    RealType C {}, U {}, fPot {};
    Vector3d r {}, rp {}, v {}, f {}, trq {}, D {}, J {}, av {};
    Vector3d EFk {}, EF {}, BF {};
    Mat3x3d I {};

    bool isCharge;

    if (doLight) {
      RealType t = info_->getSnapshotManager()->getCurrentSnapshot()->getTime();
      U          = 0.0;
      fPot       = 0.0;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginAtom(j); atom != NULL; atom = mol->nextAtom(j)) {
          isCharge = false;
          C        = 0.0;

          atype = atom->getAtomType();

          // We are not wrapping coordinates for light interactions:
          r = atom->getPos();
          v = atom->getVel();

          rp = A_ * r;  // atom's position in frame of light propagation

          // e^{ i (k*z - omega * t) } is the main oscillatory component:
          std::complex<RealType> argument(0.0, kmag_ * rp.z() - omega_ * t);
          std::complex<RealType> Ex = E0_ * jones_[0] * std::exp(argument);
          std::complex<RealType> Ey = E0_ * jones_[1] * std::exp(argument);

          EFk.x() = Ex.real();
          EFk.y() = Ey.real();
          EFk.z() = 0.0;

          EF = Ainv_ * EFk;  // electric field rotated back into lab coordinates

          // The magnetic field (BF) is perpendicular to both electric field
          // and light propagation direction:

          BF = cross(EF, khat_) / Constants::c;

          atom->addElectricField(EF);

          FixedChargeAdapter fca = FixedChargeAdapter(atype);
          if (fca.isFixedCharge()) {
            isCharge = true;
            C        = fca.getCharge();
          }

          FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atype);
          if (fqa.isFluctuatingCharge()) {
            isCharge = true;
            C += atom->getFlucQPos();
            atom->addFlucQFrc(dot(r, EF));
          }

          if (isCharge) {
            f = C * (EF + cross(v, BF));
            atom->addFrc(f);
            U = -dot(r, f);
            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }

          MultipoleAdapter ma = MultipoleAdapter(atype);
          if (ma.isDipole()) {
            D = atom->getDipole() * Constants::dipoleConvert;

            trq += cross(D, EF) + cross(D, cross(v, BF));

            atom->addTrq(trq);

            J = atom->getJ();
            I = atom->getI();
            if (atom->isLinear()) {
              l     = atom->linearAxis();
              m     = (l + 1) % 3;
              n     = (l + 2) % 3;
              av[l] = 0;
              av[m] = J[m] / I(m, m);
              av[n] = J[n] / I(n, n);
            } else {
              av = I.inverse() * J;
            }

            f = cross(cross(av, D), BF);
            atom->addFrc(f);

            U = -dot(D, EF);
            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &fPot, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      Snapshot* snap     = info_->getSnapshotManager()->getCurrentSnapshot();
      longRangePotential = snap->getLongRangePotentials();
      longRangePotential[ELECTROSTATIC_FAMILY] += fPot;
      snap->setLongRangePotentials(longRangePotential);
    }
  }